

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O1

ktx_error_code_e
ktxTexture2_transcodeLzEtc1s
          (ktxTexture2 *This,alpha_content_e alphaContent,ktxTexture2 *prototype,
          ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  bool is_video;
  ktx_uint32_t kVar1;
  ktx_uint32_t kVar2;
  ktxTexture2_private *pkVar3;
  ushort *puVar4;
  ktxTexture2_private *pkVar5;
  ktx_uint8_t *pkVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  uint32_t orig_width;
  int *piVar10;
  ktx_uint64_t kVar11;
  ktx_size_t kVar12;
  long lVar13;
  uint32_t orig_height;
  ulong uVar14;
  ktx_uint32_t kVar15;
  uint uVar16;
  ulong uVar17;
  size_type __new_size;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint32_t *puVar21;
  float fVar22;
  ktx_error_code_e local_41c;
  ulong local_418;
  ktx_uint64_t local_3f8;
  vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  xcoderStates;
  basisu_lowlevel_etc1s_transcoder bit;
  
  if (This->supercompressionScheme != KTX_SS_BASIS_LZ) {
    __assert_fail("This->supercompressionScheme == KTX_SS_BASIS_LZ",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                  ,0x1d3,
                  "ktx_error_code_e ktxTexture2_transcodeLzEtc1s(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                 );
  }
  pkVar3 = This->_private;
  puVar4 = (ushort *)pkVar3->_supercompressionGlobalData;
  if (((*(int *)(puVar4 + 2) == 0) || (*(int *)(puVar4 + 4) == 0)) || (*(int *)(puVar4 + 6) == 0)) {
    basisu::debug_printf("ktxTexture_TranscodeBasis: missing endpoints, selectors or tables");
    return KTX_FILE_DATA_ERROR;
  }
  pkVar5 = prototype->_private;
  uVar9 = This->numLevels;
  uVar17 = (ulong)uVar9;
  piVar10 = (int *)operator_new__((ulong)(uVar9 + 1) << 2);
  kVar15 = This->numFaces;
  kVar1 = This->numLayers;
  *piVar10 = 0;
  if (uVar17 != 0) {
    uVar14 = 2;
    if (2 < uVar9 + 1) {
      uVar14 = (ulong)(uVar9 + 1);
    }
    uVar9 = This->baseDepth;
    iVar18 = *piVar10;
    lVar13 = 0;
    do {
      uVar19 = uVar9 >> ((byte)lVar13 & 0x1f);
      iVar18 = iVar18 + (uVar19 + (uVar19 == 0)) * kVar15 * kVar1;
      piVar10[lVar13 + 1] = iVar18;
      lVar13 = lVar13 + 1;
    } while (uVar14 - 1 != lVar13);
  }
  if (pkVar3->_sgdByteLength <
      (ulong)*(uint *)(puVar4 + 6) +
      (ulong)*(uint *)(puVar4 + 4) +
      (ulong)*(uint *)(puVar4 + 2) + (ulong)(uint)piVar10[uVar17] * 0x14 + 0x14) {
    operator_delete__(piVar10);
    return KTX_FILE_DATA_ERROR;
  }
  basist::basisu_lowlevel_etc1s_transcoder::basisu_lowlevel_etc1s_transcoder(&bit);
  xcoderStates.
  super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  xcoderStates.
  super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  xcoderStates.
  super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = 1;
  if (This->isVideo == true) {
    __new_size = (size_type)This->numFaces;
  }
  std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>::
  resize(&xcoderStates,__new_size);
  basist::basisu_lowlevel_etc1s_transcoder::decode_palettes
            (&bit,(uint)*puVar4,(uint8_t *)(puVar4 + (ulong)(uint)piVar10[uVar17] * 10 + 10),
             *(uint *)(puVar4 + 2),(uint)puVar4[1],
             (uint8_t *)
             ((ulong)*(uint *)(puVar4 + 2) + (long)(puVar4 + (ulong)(uint)piVar10[uVar17] * 10 + 10)
             ),*(uint32_t *)(puVar4 + 4));
  basist::basisu_lowlevel_etc1s_transcoder::decode_tables
            (&bit,(uint8_t *)
                  ((long)puVar4 +
                  (ulong)*(uint *)(puVar4 + 4) + (ulong)*(uint *)(puVar4 + 2) +
                  (ulong)(uint)piVar10[uVar17] * 0x14 + 0x14),*(uint32_t *)(puVar4 + 6));
  is_video = This->isVideo;
  pkVar6 = prototype->pData;
  uVar17 = prototype->dataSize;
  uVar14 = (ulong)((prototype->_protected->_formatSize).blockSizeInBits >> 3);
  kVar15 = This->numLevels;
  local_418 = 0;
  local_41c = KTX_SUCCESS;
  do {
    kVar15 = kVar15 - 1;
    if ((int)kVar15 < 0) {
      iVar18 = 5;
      break;
    }
    kVar11 = ktxTexture2_levelDataOffset(This,kVar15);
    bVar7 = (byte)kVar15;
    uVar9 = This->baseWidth >> (bVar7 & 0x1f);
    orig_width = uVar9 + (uVar9 == 0);
    uVar9 = This->baseHeight >> (bVar7 & 0x1f);
    orig_height = uVar9 + (uVar9 == 0);
    uVar16 = This->baseDepth >> (bVar7 & 0x1f);
    kVar1 = This->numFaces;
    kVar2 = This->numLayers;
    uVar19 = kVar15 & 0x7fffffff;
    uVar9 = piVar10[uVar19];
    kVar12 = ktxTexture2_GetImageSize(prototype,kVar15);
    uVar16 = (uVar16 + (uVar16 == 0)) * kVar1 * kVar2 + uVar9;
    uVar20 = local_418;
    if (uVar9 < uVar16) {
      puVar21 = (uint32_t *)(puVar4 + (ulong)uVar9 * 10 + 0x12);
      lVar13 = (ulong)uVar16 - (ulong)uVar9;
      local_3f8 = 0;
      uVar9 = 0;
      do {
        uVar16 = 0;
        if (((long)xcoderStates.
                   super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)xcoderStates.
                   super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) * -0xf0f0f0f0f0f0f0f -
            (ulong)(uVar9 + 1) != 0) {
          uVar16 = uVar9 + 1;
        }
        if ((alphaContent == eNone) || ((iVar18 = 1, puVar21[-1] != 0 && (*puVar21 != 0)))) {
          bVar8 = basist::basisu_lowlevel_etc1s_transcoder::transcode_image
                            (&bit,outputFormat,pkVar6 + uVar20,
                             (int)(uVar17 / uVar14) - (int)(local_418 / uVar14),This->pData,
                             (uint32_t)This->dataSize,orig_width + 3 >> 2,orig_height + 3 >> 2,
                             orig_width,orig_height,kVar15,puVar21[-3] + (int)kVar11,puVar21[-2],
                             puVar21[-1] + (int)kVar11,*puVar21,transcodeFlags,alphaContent != eNone
                             ,is_video,0,
                             xcoderStates.
                             super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar9,0);
          iVar18 = 0;
          if (!bVar8) {
            local_41c = KTX_TRANSCODE_FAILED;
            iVar18 = 0xb;
          }
          else {
            uVar20 = uVar20 + kVar12;
            local_3f8 = local_3f8 + kVar12;
          }
          bVar8 = bVar8;
        }
        else {
          bVar8 = false;
        }
        if (!bVar8) goto LAB_001171b3;
        puVar21 = puVar21 + 5;
        lVar13 = lVar13 + -1;
        uVar9 = uVar16;
      } while (lVar13 != 0);
    }
    else {
      local_3f8 = 0;
    }
    pkVar5->_levelIndex[uVar19].byteOffset = local_418;
    pkVar5->_levelIndex[uVar19].byteLength = local_3f8;
    pkVar5->_levelIndex[uVar19].uncompressedByteLength = local_3f8;
    if (local_3f8 + local_418 != uVar20) {
      __assert_fail("levelOffsetWrite == writeOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                    ,0x27a,
                    "ktx_error_code_e ktxTexture2_transcodeLzEtc1s(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                   );
    }
    uVar9 = pkVar5->_requiredLevelAlignment;
    fVar22 = ceilf((float)(local_3f8 + local_418) / (float)uVar9);
    local_418 = (long)(fVar22 * (float)uVar9) & 0xffffffff;
    iVar18 = 0;
LAB_001171b3:
  } while (iVar18 == 0);
  if (iVar18 != 0xb) {
    local_41c = KTX_FILE_DATA_ERROR;
    if (iVar18 != 5) goto LAB_001171e7;
    local_41c = KTX_SUCCESS;
  }
  operator_delete__(piVar10);
LAB_001171e7:
  std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>::
  ~vector(&xcoderStates);
  basist::basisu_lowlevel_etc1s_transcoder::~basisu_lowlevel_etc1s_transcoder(&bit);
  return local_41c;
}

Assistant:

KTX_error_code
ktxTexture2_transcodeLzEtc1s(ktxTexture2* This,
                             alpha_content_e alphaContent,
                             ktxTexture2* prototype,
                             ktx_transcode_fmt_e outputFormat,
                             ktx_transcode_flags transcodeFlags)
{
    DECLARE_PRIVATE(priv, This);
    DECLARE_PRIVATE(protoPriv, prototype);
    KTX_error_code result = KTX_SUCCESS;

    assert(This->supercompressionScheme == KTX_SS_BASIS_LZ);

    uint8_t* bgd = priv._supercompressionGlobalData;
    ktxBasisLzGlobalHeader& bgdh = *reinterpret_cast<ktxBasisLzGlobalHeader*>(bgd);
    if (!(bgdh.endpointsByteLength && bgdh.selectorsByteLength && bgdh.tablesByteLength)) {
        debug_printf("ktxTexture_TranscodeBasis: missing endpoints, selectors or tables");
        return KTX_FILE_DATA_ERROR;
    }

    // Compute some helpful numbers.
    //
    // firstImages contains the indices of the first images for each level to
    // ease finding the correct slice description when iterating from smallest
    // level to largest or when randomly accessing them (t.b.c). The last array
    // entry contains the total number of images, for calculating the offsets
    // of the endpoints, etc.
    uint32_t* firstImages = new uint32_t[This->numLevels+1];

    // Temporary invariant value
    uint32_t layersFaces = This->numLayers * This->numFaces;
    firstImages[0] = 0;
    for (uint32_t level = 1; level <= This->numLevels; level++) {
        // NOTA BENE: numFaces * depth is only reasonable because they can't
        // both be > 1. I.e there are no 3d cubemaps.
        firstImages[level] = firstImages[level - 1]
                           + layersFaces * MAX(This->baseDepth >> (level - 1), 1);
    }
    uint32_t& imageCount = firstImages[This->numLevels];

    if (BGD_TABLES_ADDR(0, bgdh, imageCount) + bgdh.tablesByteLength > priv._sgdByteLength) {
        // Compiler will not allow `goto cleanup;` because "jump bypasses variable initialization."
        // The static initializations below this and before the loop are presumably the issue
        // as the compiler is,presumably, inserting code to destruct those at the end of the
        // function.
        delete[] firstImages;
        return KTX_FILE_DATA_ERROR;
    }
    // FIXME: Do more validation.

    // Prepare low-level transcoder for transcoding slices.
    basist::basisu_lowlevel_etc1s_transcoder bit;

    // basisu_transcoder_state is used to find the previous frame when
    // decoding a video P-Frame. It tracks the previous frame for each mip
    // level. For cube map array textures we need to find the previous frame
    // for each face so we a state per face. Although providing this is only
    // needed for video, it is easier to always pass our own.
    std::vector<basisu_transcoder_state> xcoderStates;
    xcoderStates.resize(This->isVideo ? This->numFaces : 1);

    bit.decode_palettes(bgdh.endpointCount, BGD_ENDPOINTS_ADDR(bgd, imageCount),
                        bgdh.endpointsByteLength,
                        bgdh.selectorCount, BGD_SELECTORS_ADDR(bgd, bgdh, imageCount),
                        bgdh.selectorsByteLength);

    bit.decode_tables(BGD_TABLES_ADDR(bgd, bgdh, imageCount),
                      bgdh.tablesByteLength);

    // Find matching VkFormat and calculate output sizes.

    const bool isVideo = This->isVideo;

    ktx_uint8_t* pXcodedData = prototype->pData;
    // Inconveniently, the output buffer size parameter of transcode_image
    // has to be in pixels for uncompressed output and in blocks for
    // compressed output. The only reason for humouring the API is so
    // its buffer size tests provide a real check. An alternative is to
    // always provide the size in bytes which will always pass.
    ktx_uint32_t outputBlockByteLength
                      = prototype->_protected->_formatSize.blockSizeInBits / 8;
    ktx_size_t xcodedDataLength
                      = prototype->dataSize / outputBlockByteLength;
    ktxLevelIndexEntry* protoLevelIndex;
    uint64_t levelOffsetWrite;
    const ktxBasisLzEtc1sImageDesc* imageDescs = BGD_ETC1S_IMAGE_DESCS(bgd);

    // Finally we're ready to transcode the slices.

    // FIXME: Iframe flag needs to be queryable by the application. In Basis
    // the app can query file_info and image_info from the transcoder which
    // returns a structure with lots of info about the image.

    protoLevelIndex = protoPriv._levelIndex;
    levelOffsetWrite = 0;
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        uint64_t levelOffset = ktxTexture2_levelDataOffset(This, level);
        uint64_t writeOffset = levelOffsetWrite;
        uint64_t writeOffsetBlocks = levelOffsetWrite / outputBlockByteLength;
        uint32_t levelWidth = MAX(1, This->baseWidth >> level);
        uint32_t levelHeight = MAX(1, This->baseHeight >> level);
        // ETC1S texel block dimensions
        const uint32_t bw = 4, bh = 4;
        uint32_t levelBlocksX = (levelWidth + (bw - 1)) / bw;
        uint32_t levelBlocksY = (levelHeight + (bh - 1)) / bh;
        uint32_t depth = MAX(1, This->baseDepth >> level);
        //uint32_t faceSlices = This->numFaces == 1 ? depth : This->numFaces;
        uint32_t faceSlices = This->numFaces * depth;
        uint32_t numImages = This->numLayers * faceSlices;
        uint32_t image = firstImages[level];
        uint32_t endImage = image + numImages;
        ktx_size_t levelImageSizeOut, levelSizeOut;
        uint32_t stateIndex = 0;

        levelSizeOut = 0;
        // FIXME: Figure out a way to get the size out of the transcoder.
        levelImageSizeOut = ktxTexture2_GetImageSize(prototype, level);
        for (; image < endImage; image++) {
            const ktxBasisLzEtc1sImageDesc& imageDesc = imageDescs[image];

            basisu_transcoder_state& xcoderState = xcoderStates[stateIndex];
            // We have face0 [face1 ...] within each layer. Use `stateIndex`
            // rather than a double loop of layers and faceSlices as this
            // works for 3d texture and non-array cube maps as well as
            // cube map arrays without special casing.
            if (++stateIndex == xcoderStates.size())
                stateIndex = 0;

            if (alphaContent != eNone)
            {
                // The slice descriptions should have alpha information.
                if (imageDesc.alphaSliceByteOffset == 0
                    || imageDesc.alphaSliceByteLength == 0)
                    return KTX_FILE_DATA_ERROR;
            }

            bool status;
            status = bit.transcode_image(
                      (transcoder_texture_format)outputFormat,
                      pXcodedData + writeOffset,
                      (uint32_t)(xcodedDataLength - writeOffsetBlocks),
                      This->pData,
                      (uint32_t)This->dataSize,
                      levelBlocksX,
                      levelBlocksY,
                      levelWidth,
                      levelHeight,
                      level,
                      (uint32_t)(levelOffset + imageDesc.rgbSliceByteOffset),
                      imageDesc.rgbSliceByteLength,
                      (uint32_t)(levelOffset + imageDesc.alphaSliceByteOffset),
                      imageDesc.alphaSliceByteLength,
                      transcodeFlags,
                      alphaContent != eNone,
                      isVideo,
                      // Our P-Frame flag is in the same bit as
                      // cSliceDescFlagsFrameIsIFrame. We have to
                      // invert it to make it an I-Frame flag.
                      //
                      // API currently doesn't have any way to pass
                      // the I-Frame flag.
                      //imageDesc.imageFlags ^ cSliceDescFlagsFrameIsIFrame,
                      0, // output_row_pitch_in_blocks_or_pixels
                      &xcoderState,
                      0  // output_rows_in_pixels
                      );
            if (!status) {
                result = KTX_TRANSCODE_FAILED;
                goto cleanup;
            }

            writeOffset += levelImageSizeOut;
            levelSizeOut += levelImageSizeOut;
        } // end images loop
        protoLevelIndex[level].byteOffset = levelOffsetWrite;
        protoLevelIndex[level].byteLength = levelSizeOut;
        protoLevelIndex[level].uncompressedByteLength = levelSizeOut;
        levelOffsetWrite += levelSizeOut;
        assert(levelOffsetWrite == writeOffset);
        // In case of transcoding to uncompressed.
        levelOffsetWrite = _KTX_PADN(protoPriv._requiredLevelAlignment,
                                     levelOffsetWrite);
    } // level loop

    result = KTX_SUCCESS;

cleanup:
    delete[] firstImages;
    return result;
}